

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lock.c
# Opt level: O1

int doforce(void)

{
  uint uVar1;
  char cVar2;
  char *pcVar3;
  uint uVar4;
  obj *obj;
  char *pcVar5;
  char qbuf [128];
  char acStack_b8 [136];
  
  if (uwep == (obj *)0x0) {
    pcVar5 = "";
  }
  else {
    cVar2 = uwep->oclass;
    pcVar5 = "proper ";
    if (((cVar2 == '\x02') || (cVar2 == '\x0e')) ||
       ((cVar2 == '\x06' && (objects[uwep->otyp].oc_subtyp != '\0')))) {
      if ((0xea < (byte)(objects[uwep->otyp].oc_subtyp - 0x16U)) &&
         ((uVar4 = (ushort)uwep->otyp - 0x3d, 3 < uVar4 || (uVar4 == 1)))) {
        uVar4 = (uint)(objects[uwep->otyp].oc_subtyp < '\v' && cVar2 == '\x02');
        if (((xlock_4 == 0) || (xlock_1 == (obj *)0x0)) || (xlock_2 != uVar4)) {
          xlock_1 = (obj *)0x0;
          for (obj = level->objects[u.ux][u.uy]; obj != (obj *)0x0; obj = (obj->v).v_nexthere) {
            if ((ushort)(obj->otyp - 0xdaU) < 3) {
              if (obj->otyp == 0xdc) {
                pcVar5 = xname(obj);
                pcVar5 = the(pcVar5);
                pline("You have no way to force %s",pcVar5);
              }
              else {
                uVar1 = *(uint *)&obj->field_0x4a;
                pcVar5 = doname(obj);
                if ((uVar1 & 0x6000) == 0x2000) {
                  pcVar3 = simple_typename((int)obj->otyp);
                  pcVar3 = an(pcVar3);
                  pcVar5 = safe_qbuf("",0x20,pcVar5,pcVar3,"a box");
                  sprintf(acStack_b8,"There is %s here, force its lock?",pcVar5);
                  cVar2 = yn_function(acStack_b8,"ynq",'q');
                  if (cVar2 != 'n') {
                    if (cVar2 == 'q') {
                      return 0;
                    }
                    pcVar5 = xname(uwep);
                    pcVar3 = "You start bashing it with your %s.";
                    if (uVar4 != 0) {
                      pcVar3 = "You force your %s into a crack and pry.";
                    }
                    pline(pcVar3,pcVar5);
                    xlock_3 = objects[uwep->otyp].oc_wldam * 2;
                    xlock_4 = 0;
                    xlock_1 = obj;
                    xlock_2 = uVar4;
                    break;
                  }
                }
                else {
                  pcVar3 = "broken";
                  if ((*(uint *)&obj->field_0x4a >> 0xe & 1) == 0) {
                    pcVar3 = "unlocked";
                  }
                  pline("There is %s here, but its lock is already %s.",pcVar5,pcVar3);
                }
              }
            }
          }
          if (xlock_1 == (obj *)0x0) {
            pline("You decide not to force the issue.");
            return 1;
          }
        }
        else {
          pline("You resume your attempt to force the lock.","proper ");
        }
        set_occupation(forcelock,"forcing the lock",0);
        return 1;
      }
    }
  }
  pline("You can\'t force anything without a %sweapon.",pcVar5);
  return 0;
}

Assistant:

int doforce(void)
{
	struct obj *otmp;
	int c, picktyp;
	char qbuf[QBUFSZ];

	if (!uwep ||	/* proper type test */
	    (uwep->oclass != WEAPON_CLASS && !is_weptool(uwep) &&
	     uwep->oclass != ROCK_CLASS) ||
	    (objects[uwep->otyp].oc_skill < P_DAGGER) ||
	    (objects[uwep->otyp].oc_skill > P_LANCE) ||
	    uwep->otyp == FLAIL || uwep->otyp == AKLYS ||
	    uwep->otyp == RUBBER_HOSE) {
	    pline("You can't force anything without a %sweapon.", (uwep) ? "proper " : "");
	    return 0;
	}

	picktyp = is_blade(uwep);
	if (xlock.usedtime && xlock.box && picktyp == xlock.picktyp) {
	    pline("You resume your attempt to force the lock.");
	    set_occupation(forcelock, "forcing the lock", 0);
	    return 1;
	}

	/* A lock is made only for the honest man, the thief will break it. */
	xlock.box = NULL;
	for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere)
	    if (Is_box(otmp)) {
		if (otmp->otyp == IRON_SAFE) {
		    pline("You have no way to force %s", the(xname(otmp)));
		    continue;
		}
		if (otmp->obroken || !otmp->olocked) {
		    pline("There is %s here, but its lock is already %s.",
			  doname(otmp), otmp->obroken ? "broken" : "unlocked");
		    continue;
		}
		sprintf(qbuf,"There is %s here, force its lock?",
			safe_qbuf("", sizeof("There is  here, force its lock?"),
				doname(otmp), an(simple_typename(otmp->otyp)),
				"a box"));

		c = ynq(qbuf);
		if (c == 'q') return 0;
		if (c == 'n') continue;

		if (picktyp)
		    pline("You force your %s into a crack and pry.", xname(uwep));
		else
		    pline("You start bashing it with your %s.", xname(uwep));
		xlock.box = otmp;
		xlock.chance = objects[uwep->otyp].oc_wldam * 2;
		xlock.picktyp = picktyp;
		xlock.usedtime = 0;
		break;
	    }

	if (xlock.box)	set_occupation(forcelock, "forcing the lock", 0);
	else		pline("You decide not to force the issue.");
	return 1;
}